

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_binding.cpp
# Opt level: O0

void lumeview::ImGui_NewFrame(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ImGuiIO *pIVar6;
  ivec4 *piVar7;
  rep_conflict1 rVar8;
  int local_64;
  ImVec2 IStack_60;
  int i;
  undefined8 local_58;
  vec2 cursorPos;
  duration<float,std::ratio<1l,1l>> local_44 [4];
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  time_point curTime;
  ImVec2 local_30;
  undefined8 uStack_28;
  ivec4 vp;
  ImGuiIO *io;
  
  if (g_FontTexture == 0) {
    ImGui_CreateDeviceObjects();
  }
  pIVar6 = ImGui::GetIO();
  piVar7 = WindowEventListener::viewport((WindowEventListener *)g_eventListener);
  uVar1 = *(undefined8 *)&piVar7->field_0;
  uVar2 = *(undefined8 *)((long)&piVar7->field_0 + 8);
  vp.field_0.field_0.x = (int)uVar2;
  uStack_28._0_4_ = (int)uVar1;
  uStack_28._4_4_ = (int)((ulong)uVar1 >> 0x20);
  iVar4 = vp.field_0.field_0.x - (int)uStack_28;
  vp.field_0.field_0.y = (int)((ulong)uVar2 >> 0x20);
  iVar5 = vp.field_0.field_0.y - uStack_28._4_4_;
  uStack_28 = uVar1;
  vp.field_0._0_8_ = uVar2;
  ImVec2::ImVec2(&local_30,(float)iVar4,(float)iVar5);
  pIVar6->DisplaySize = local_30;
  ImVec2::ImVec2((ImVec2 *)&curTime,1.0,1.0);
  pIVar6->DisplayFramebufferScale = (ImVec2)curTime.__d.__r;
  local_40.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  cursorPos.field_0 =
       (anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2)
       std::chrono::operator-
                 (&local_40,
                  (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *)&g_Time);
  std::chrono::duration<float,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (local_44,(duration<long,_std::ratio<1L,_1000000000L>_> *)&cursorPos);
  rVar8 = std::chrono::duration<float,_std::ratio<1L,_1L>_>::count
                    ((duration<float,_std::ratio<1L,_1L>_> *)local_44);
  pIVar6->DeltaTime = rVar8;
  g_Time = local_40.__d.__r;
  local_58 = (anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2_0
              )WindowEventListener::cursor_position((WindowEventListener *)g_eventListener);
  ImVec2::ImVec2(&stack0xffffffffffffffa0,(float)local_58,local_58._4_4_);
  pIVar6->MousePos = IStack_60;
  for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
    bVar3 = WindowEventListener::mouse_button_is_down
                      ((WindowEventListener *)g_eventListener,local_64);
    pIVar6->MouseDown[local_64] = bVar3;
  }
  ImGui::NewFrame();
  return;
}

Assistant:

void ImGui_NewFrame()
{
    if (!g_FontTexture)
        ImGui_CreateDeviceObjects();

    ImGuiIO& io = ImGui::GetIO();

    const glm::ivec4 vp = g_eventListener.viewport();
    io.DisplaySize = ImVec2(float(vp.z - vp.x), float(vp.w - vp.y));
	io.DisplayFramebufferScale = ImVec2(1.f, 1.f);


    // Setup time step
    const auto curTime =  clock::now();
    io.DeltaTime = chrono::duration <float> (curTime - g_Time).count();
    g_Time = curTime;

    // Setip mouse
	const glm::vec2 cursorPos = g_eventListener.cursor_position();
	io.MousePos = ImVec2(cursorPos.x, cursorPos.y);

    for (int i = 0; i < 3; i++)
        io.MouseDown[i] = g_eventListener.mouse_button_is_down (i);

    // // Update OS/hardware mouse cursor if imgui isn't drawing a software cursor
    // if ((io.ConfigFlags & ImGuiConfigFlags_NoMouseCursorChange) == 0 && glfwGetInputMode(g_Window, GLFW_CURSOR) != GLFW_CURSOR_DISABLED)
    // {
    //     ImGuiMouseCursor cursor = ImGui::GetMouseCursor();
    //     if (io.MouseDrawCursor || cursor == ImGuiMouseCursor_None)
    //     {
    //         glfwSetInputMode(g_Window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
    //     }
    //     else
    //     {
    //         glfwSetCursor(g_Window, g_MouseCursors[cursor] ? g_MouseCursors[cursor] : g_MouseCursors[ImGuiMouseCursor_Arrow]);
    //         glfwSetInputMode(g_Window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
    //     }
    // }

    // // Gamepad navigation mapping [BETA]
    // memset(io.NavInputs, 0, sizeof(io.NavInputs));
    // if (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad)
    // {
    //     // Update gamepad inputs
    //     #define MAP_BUTTON(NAV_NO, BUTTON_NO)       { if (buttons_count > BUTTON_NO && buttons[BUTTON_NO] == GLFW_PRESS) io.NavInputs[NAV_NO] = 1.0f; }
    //     #define MAP_ANALOG(NAV_NO, AXIS_NO, V0, V1) { float v = (axes_count > AXIS_NO) ? axes[AXIS_NO] : V0; v = (v - V0) / (V1 - V0); if (v > 1.0f) v = 1.0f; if (io.NavInputs[NAV_NO] < v) io.NavInputs[NAV_NO] = v; }
    //     int axes_count = 0, buttons_count = 0;
    //     const float* axes = glfwGetJoystickAxes(GLFW_JOYSTICK_1, &axes_count);
    //     const unsigned char* buttons = glfwGetJoystickButtons(GLFW_JOYSTICK_1, &buttons_count);
    //     MAP_BUTTON(ImGuiNavInput_Activate,   0);     // Cross / A
    //     MAP_BUTTON(ImGuiNavInput_Cancel,     1);     // Circle / B
    //     MAP_BUTTON(ImGuiNavInput_Menu,       2);     // Square / X
    //     MAP_BUTTON(ImGuiNavInput_Input,      3);     // Triangle / Y
    //     MAP_BUTTON(ImGuiNavInput_DpadLeft,   13);    // D-Pad Left
    //     MAP_BUTTON(ImGuiNavInput_DpadRight,  11);    // D-Pad Right
    //     MAP_BUTTON(ImGuiNavInput_DpadUp,     10);    // D-Pad Up
    //     MAP_BUTTON(ImGuiNavInput_DpadDown,   12);    // D-Pad Down
    //     MAP_BUTTON(ImGuiNavInput_FocusPrev,  4);     // L1 / LB
    //     MAP_BUTTON(ImGuiNavInput_FocusNext,  5);     // R1 / RB
    //     MAP_BUTTON(ImGuiNavInput_TweakSlow,  4);     // L1 / LB
    //     MAP_BUTTON(ImGuiNavInput_TweakFast,  5);     // R1 / RB
    //     MAP_ANALOG(ImGuiNavInput_LStickLeft, 0,  -0.3f,  -0.9f);
    //     MAP_ANALOG(ImGuiNavInput_LStickRight,0,  +0.3f,  +0.9f);
    //     MAP_ANALOG(ImGuiNavInput_LStickUp,   1,  +0.3f,  +0.9f);
    //     MAP_ANALOG(ImGuiNavInput_LStickDown, 1,  -0.3f,  -0.9f);
    //     #undef MAP_BUTTON
    //     #undef MAP_ANALOG
    //     if (axes_count > 0 && buttons_count > 0) 
    //         io.BackendFlags |= ImGuiBackendFlags_HasGamepad; 
    //     else 
    //         io.BackendFlags &= ~ImGuiBackendFlags_HasGamepad;
    // }

    // Start the frame. This call will update the io.WantCaptureMouse, io.WantCaptureKeyboard flag that you can use to dispatch inputs (or not) to your application.
    ImGui::NewFrame();
}